

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::LinearDerivateCase::LinearDerivateCase
          (LinearDerivateCase *this,Context *context,char *name,char *description,DerivateFunc func,
          DataType type,Precision precision,deUint32 hint,SurfaceType surfaceType,int numSamples,
          char *fragmentSrcTmpl)

{
  allocator<char> local_29;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,description);
  (this->super_TriangleDerivateCase).super_TestCase.m_context = context;
  (this->super_TriangleDerivateCase).m_dataType = TYPE_LAST;
  (this->super_TriangleDerivateCase).m_precision = PRECISION_LAST;
  (this->super_TriangleDerivateCase).m_coordDataType = TYPE_LAST;
  (this->super_TriangleDerivateCase).m_coordPrecision = PRECISION_LAST;
  (this->super_TriangleDerivateCase).m_fragmentSrc._M_dataplus._M_p =
       (pointer)&(this->super_TriangleDerivateCase).m_fragmentSrc.field_2;
  (this->super_TriangleDerivateCase).m_fragmentSrc._M_string_length = 0;
  (this->super_TriangleDerivateCase).m_fragmentSrc.field_2._M_local_buf[0] = '\0';
  (this->super_TriangleDerivateCase).m_coordMin.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMin.m_data[1] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMin.m_data[2] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMin.m_data[3] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMax.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMax.m_data[1] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMax.m_data[2] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMax.m_data[3] = 0.0;
  (this->super_TriangleDerivateCase).m_derivScale.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_derivScale.m_data[1] = 0.0;
  (this->super_TriangleDerivateCase).m_derivScale.m_data[2] = 0.0;
  (this->super_TriangleDerivateCase).m_derivScale.m_data[3] = 0.0;
  (this->super_TriangleDerivateCase).m_derivBias.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_derivBias.m_data[1] = 0.0;
  (this->super_TriangleDerivateCase).m_derivBias.m_data[2] = 0.0;
  (this->super_TriangleDerivateCase).m_derivBias.m_data[3] = 0.0;
  (this->super_TriangleDerivateCase).m_surfaceType = SURFACETYPE_DEFAULT_FRAMEBUFFER;
  (this->super_TriangleDerivateCase).m_numSamples = 0;
  (this->super_TriangleDerivateCase).m_hint = 0x1100;
  (this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__LinearDerivateCase_00d36180;
  *(DerivateFunc *)&(this->super_TriangleDerivateCase).field_0xf4 = func;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_fragmentTmpl,fragmentSrcTmpl,&local_29);
  (this->super_TriangleDerivateCase).m_dataType = type;
  (this->super_TriangleDerivateCase).m_precision = precision;
  (this->super_TriangleDerivateCase).m_coordDataType = type;
  (this->super_TriangleDerivateCase).m_coordPrecision = precision;
  (this->super_TriangleDerivateCase).m_hint = hint;
  (this->super_TriangleDerivateCase).m_surfaceType = surfaceType;
  (this->super_TriangleDerivateCase).m_numSamples = numSamples;
  return;
}

Assistant:

LinearDerivateCase::LinearDerivateCase (Context& context, const char* name, const char* description, DerivateFunc func, glu::DataType type, glu::Precision precision, deUint32 hint, SurfaceType surfaceType, int numSamples, const char* fragmentSrcTmpl)
	: TriangleDerivateCase	(context, name, description)
	, m_func				(func)
	, m_fragmentTmpl		(fragmentSrcTmpl)
{
	m_dataType			= type;
	m_precision			= precision;
	m_coordDataType		= m_dataType;
	m_coordPrecision	= m_precision;
	m_hint				= hint;
	m_surfaceType		= surfaceType;
	m_numSamples		= numSamples;
}